

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.cpp
# Opt level: O1

bool __thiscall
HPack::Encoder::encodeRequestPseudoHeaders
          (Encoder *this,BitOStream *outputStream,HttpHeader *header)

{
  pointer pHVar1;
  size_t __n;
  QDebug QVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  char *pcVar9;
  size_t *psVar10;
  long lVar11;
  pointer field;
  long in_FS_OFFSET;
  bool bVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  bool headerFound [3];
  QByteArrayView headerName [3];
  QDebug local_b0;
  undefined8 local_a8;
  undefined4 uStack_a0;
  undefined8 uStack_9c;
  undefined4 local_94;
  char *local_90;
  QArrayData *local_88 [3];
  char local_6c [4];
  size_t local_68;
  char *local_60 [5];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68 = 10;
  local_60[0] = ":authority";
  local_60[1] = (char *)0x7;
  local_60[2] = ":scheme";
  local_60[3] = (char *)0x5;
  local_60[4] = ":path";
  local_6c[2] = 0;
  local_6c[0] = '\0';
  local_6c[1] = '\0';
  field = (header->super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>).
          _M_impl.super__Vector_impl_data._M_start;
  pHVar1 = (header->super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  bVar12 = field == pHVar1;
  if (bVar12) {
    bVar6 = false;
  }
  else {
    bVar6 = false;
    do {
      local_a8._0_4_ = 0x2692a5;
      local_a8._4_4_ = 0;
      bVar4 = ::operator==(&field->name,(char **)&local_a8);
      if (bVar4) {
        pcVar9 = "invalid pseudo-header (:status) in a request";
LAB_001dbf60:
        local_90 = "default";
        local_94 = 0;
        uStack_9c = 0;
        uStack_a0 = 0;
        local_a8._4_4_ = 0;
        local_a8._0_4_ = 2;
        bVar4 = false;
        QMessageLogger::critical((char *)&local_a8,pcVar9);
      }
      else {
        local_a8._0_4_ = 0x269313;
        local_a8._4_4_ = 0;
        bVar4 = ::operator==(&field->name,(char **)&local_a8);
        if (bVar4) {
          if (bVar6) {
            pcVar9 = "only one :method pseudo-header is allowed";
            goto LAB_001dbf60;
          }
          encodeMethod(this,outputStream,field);
          bVar4 = true;
          bVar6 = true;
        }
        else {
          local_a8._0_4_ = 0x262913;
          local_a8._4_4_ = 0;
          bVar5 = ::operator==(&field->name,(char **)&local_a8);
          bVar4 = true;
          if (!bVar5) {
            pcVar9 = (field->name).d.ptr;
            __n = (field->name).d.size;
            psVar10 = (size_t *)local_60;
            lVar11 = 0;
            do {
              if ((__n == psVar10[-1]) &&
                 ((__n == 0 || (iVar7 = bcmp(pcVar9,(void *)*psVar10,__n), iVar7 == 0)))) {
                if (local_6c[lVar11] == '\x01') {
                  local_a8._0_4_ = 2;
                  local_a8._4_4_ = 0;
                  uStack_a0 = 0;
                  uStack_9c = 0;
                  local_94 = 0;
                  local_90 = "default";
                  QMessageLogger::critical();
                  QVar2.stream = local_b0.stream;
                  QVar13.m_data = (storage_type *)0x8;
                  QVar13.m_size = (qsizetype)local_88;
                  QString::fromUtf8(QVar13);
                  QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)local_88);
                  if (local_88[0] != (QArrayData *)0x0) {
                    LOCK();
                    (local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                         (local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if ((local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(local_88[0],2,0x10);
                    }
                  }
                  if (*(QTextStream *)(local_b0.stream + 0x30) == (QTextStream)0x1) {
                    QTextStream::operator<<((QTextStream *)local_b0.stream,' ');
                  }
                  QDebug::putByteArray((char *)&local_b0,*psVar10,(Latin1Content)psVar10[-1]);
                  if (*(QTextStream *)(local_b0.stream + 0x30) == (QTextStream)0x1) {
                    QTextStream::operator<<((QTextStream *)local_b0.stream,' ');
                  }
                  QVar2.stream = local_b0.stream;
                  QVar14.m_data = (storage_type *)0x18;
                  QVar14.m_size = (qsizetype)local_88;
                  QString::fromUtf8(QVar14);
                  QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)local_88);
                  if (local_88[0] != (QArrayData *)0x0) {
                    LOCK();
                    (local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                         (local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if ((local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(local_88[0],2,0x10);
                    }
                  }
                  if (*(QTextStream *)(local_b0.stream + 0x30) == (QTextStream)0x1) {
                    QTextStream::operator<<((QTextStream *)local_b0.stream,' ');
                  }
                  QDebug::~QDebug(&local_b0);
                  bVar4 = false;
                }
                else {
                  bVar4 = encodeHeaderField(this,outputStream,field);
                  if (bVar4) {
                    local_6c[lVar11] = '\x01';
                  }
                }
                break;
              }
              lVar11 = lVar11 + 1;
              psVar10 = psVar10 + 2;
            } while (lVar11 != 3);
          }
        }
      }
      if (!bVar4) break;
      field = field + 1;
      bVar12 = field == pHVar1;
    } while (!bVar12);
  }
  if (bVar12) {
    if (bVar6) {
      if (local_6c[1] == '\x01') {
        uVar3 = 0;
        do {
          uVar8 = uVar3;
          if (uVar8 == 1) {
            bVar12 = true;
            goto LAB_001dc11d;
          }
          uVar3 = uVar8 + 1;
        } while (local_6c[uVar8 + 2] != '\0');
        bVar12 = 1 < uVar8 + 1;
        lVar11 = uVar8 + 2;
      }
      else {
        lVar11 = 1;
        bVar12 = false;
      }
      local_a8._0_4_ = 2;
      local_a8._4_4_ = 0;
      uStack_a0 = 0;
      uStack_9c = 0;
      local_94 = 0;
      local_90 = "default";
      QMessageLogger::critical();
      QVar2.stream = local_b0.stream;
      QVar15.m_data = (storage_type *)0x9;
      QVar15.m_size = (qsizetype)local_88;
      QString::fromUtf8(QVar15);
      QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)local_88);
      if (local_88[0] != (QArrayData *)0x0) {
        LOCK();
        (local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_88[0],2,0x10);
        }
      }
      if (*(QTextStream *)(local_b0.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_b0.stream,' ');
      }
      QDebug::putByteArray
                ((char *)&local_b0,*(ulong *)((long)local_60 + lVar11 * 0x10),
                 (Latin1Content)*(undefined8 *)((long)local_60 + (lVar11 * 2 + -1) * 8));
      if (*(QTextStream *)(local_b0.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_b0.stream,' ');
      }
      QVar2.stream = local_b0.stream;
      QVar16.m_data = (storage_type *)0x17;
      QVar16.m_size = (qsizetype)local_88;
      QString::fromUtf8(QVar16);
      QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)local_88);
      if (local_88[0] != (QArrayData *)0x0) {
        LOCK();
        (local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_88[0],2,0x10);
        }
      }
      if (*(QTextStream *)(local_b0.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_b0.stream,' ');
      }
      QDebug::~QDebug(&local_b0);
      goto LAB_001dc11d;
    }
    encodeRequestPseudoHeaders();
  }
  bVar12 = false;
LAB_001dc11d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar12;
  }
  __stack_chk_fail();
}

Assistant:

bool Encoder::encodeRequestPseudoHeaders(BitOStream &outputStream,
                                         const HttpHeader &header)
{
    // The following pseudo-header fields are defined for HTTP/2 requests:
    // - The :method pseudo-header field includes the HTTP method
    // - The :scheme pseudo-header field includes the scheme portion of the target URI
    // - The :authority pseudo-header field includes the authority portion of the target URI
    // - The :path pseudo-header field includes the path and query parts of the target URI

    // All HTTP/2 requests MUST include exactly one valid value for the :method,
    // :scheme, and :path pseudo-header fields, unless it is a CONNECT request
    // (Section 8.3). An HTTP request that omits mandatory pseudo-header fields
    // is malformed (Section 8.1.2.6).

    using size_type = decltype(header.size());

    bool methodFound = false;
    constexpr QByteArrayView headerName[] = {":authority", ":scheme", ":path"};
    constexpr size_type nHeaders = std::size(headerName);
    bool headerFound[nHeaders] = {};

    for (const auto &field : header) {
        if (field.name == ":status") {
            qCritical("invalid pseudo-header (:status) in a request");
            return false;
        }

        if (field.name == ":method") {
            if (methodFound) {
                qCritical("only one :method pseudo-header is allowed");
                return false;
            }

            if (!encodeMethod(outputStream, field))
                return false;
            methodFound = true;
        } else if (field.name == "cookie") {
            // "crumbs" ...
        } else {
            for (size_type j = 0; j < nHeaders; ++j) {
                if (field.name == headerName[j]) {
                    if (headerFound[j]) {
                        qCritical() << "only one" << headerName[j] << "pseudo-header is allowed";
                        return false;
                    }
                    if (!encodeHeaderField(outputStream, field))
                        return false;
                    headerFound[j] = true;
                    break;
                }
            }
        }
    }

    if (!methodFound) {
        qCritical("mandatory :method pseudo-header not found");
        return false;
    }

    // 1: don't demand headerFound[0], as :authority isn't mandatory.
    for (size_type i = 1; i < nHeaders; ++i) {
        if (!headerFound[i]) {
            qCritical() << "mandatory" << headerName[i]
                        << "pseudo-header not found";
            return false;
        }
    }

    return true;
}